

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int combine_delete_insn(gen_ctx_t gen_ctx,MIR_insn_t def_insn,bb_insn_t_conflict bb_insn)

{
  dead_var_t_conflict *ppdVar1;
  char cVar2;
  MIR_reg_t MVar3;
  combine_ctx *pcVar4;
  dead_var_t_conflict pdVar5;
  dead_var_t pdVar6;
  void *pvVar7;
  dead_var_t pdVar8;
  MIR_insn_t_conflict insn;
  uint uVar9;
  int iVar10;
  int iVar11;
  var_ref_t *pvVar12;
  MIR_reg_t MVar13;
  DLIST_LINK_dead_var_t *pDVar14;
  DLIST_dead_var_t *pDVar15;
  MIR_context_t pMVar16;
  dead_var_t *ppdVar17;
  MIR_module_t extraout_RDX;
  MIR_insn_t pMVar18;
  dead_var_t_conflict pdVar19;
  dead_var_t *ppdVar20;
  gen_ctx_t gen_ctx_00;
  ulong uVar21;
  size_t nop;
  bool bVar22;
  int local_4c;
  DLIST_dead_var_t *local_48;
  long local_40;
  DLIST_LINK_dead_var_t *local_38;
  
  if (def_insn->ops[0].field_0x8 != '\x02') {
LAB_0017197b:
    __assert_fail("def_insn->ops[0].mode == MIR_OP_VAR",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x2214,"int combine_delete_insn(gen_ctx_t, MIR_insn_t, bb_insn_t)");
  }
  pcVar4 = gen_ctx->combine_ctx;
  uVar9 = def_insn->ops[0].u.reg;
  uVar21 = (ulong)uVar9;
  iVar11 = 0;
  if ((pcVar4->var_ref_ages_addr[uVar21] == pcVar4->curr_bb_var_ref_age) &&
     (local_40 = uVar21 * 0x20, iVar11 = 0, pcVar4->var_refs_addr[uVar21].del_p == '\0')) {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("      deleting now dead insn ",0x1d,1,(FILE *)gen_ctx->debug_file);
      print_bb_insn(gen_ctx,(bb_insn_t_conflict)def_insn->data,1);
    }
    if (uVar9 == 0xffffffff) goto LAB_001719a9;
    pdVar19 = (bb_insn->insn_dead_vars).head;
    local_48 = &bb_insn->insn_dead_vars;
    if (pdVar19 != (dead_var_t_conflict)0x0) {
      ppdVar1 = &(bb_insn->insn_dead_vars).tail;
      do {
        pdVar5 = (pdVar19->dead_var_link).next;
        if (pdVar19->var == uVar9) {
          pdVar6 = (pdVar19->dead_var_link).prev;
          if (pdVar6 == (dead_var_t)0x0) {
            pDVar15 = local_48;
            if (local_48->head == pdVar19) goto LAB_00171761;
            combine_delete_insn_cold_1();
LAB_0017199f:
            combine_delete_insn_cold_2();
            goto LAB_001719a4;
          }
          pDVar15 = (DLIST_dead_var_t *)&(pdVar6->dead_var_link).next;
LAB_00171761:
          pDVar15->head = pdVar5;
          if (pdVar5 == (dead_var_t_conflict)0x0) {
            pDVar14 = (DLIST_LINK_dead_var_t *)ppdVar1;
            if (*ppdVar1 != pdVar19) goto LAB_0017199f;
          }
          else {
            pDVar14 = &pdVar5->dead_var_link;
          }
          pDVar14->prev = pdVar6;
          (pdVar19->dead_var_link).prev = (dead_var_t)0x0;
          (pdVar19->dead_var_link).next = (dead_var_t)0x0;
          free_dead_var(gen_ctx,pdVar19);
        }
        pdVar19 = pdVar5;
      } while (pdVar5 != (dead_var_t_conflict)0x0);
    }
    pvVar7 = def_insn->data;
    pdVar19 = *(dead_var_t_conflict *)((long)pvVar7 + 0x38);
    if (pdVar19 != (dead_var_t_conflict)0x0) {
      ppdVar20 = (dead_var_t *)((long)pvVar7 + 0x38);
      local_38 = (DLIST_LINK_dead_var_t *)((long)pvVar7 + 0x40);
      do {
        pdVar6 = (pdVar19->dead_var_link).prev;
        pdVar8 = (pdVar19->dead_var_link).next;
        ppdVar17 = &(pdVar6->dead_var_link).next;
        if (pdVar6 == (dead_var_t)0x0) {
          ppdVar17 = ppdVar20;
        }
        *ppdVar17 = pdVar8;
        if (pdVar8 == (dead_var_t)0x0) {
          pDVar14 = local_38;
          if (local_38->prev != pdVar19) {
            combine_delete_insn_cold_3();
            goto LAB_0017197b;
          }
        }
        else {
          pDVar14 = &pdVar8->dead_var_link;
        }
        pDVar14->prev = pdVar6;
        uVar21 = 0;
        nop = 0;
        (pdVar19->dead_var_link).prev = (dead_var_t)0x0;
        (pdVar19->dead_var_link).next = (dead_var_t)0x0;
        MVar3 = pdVar19->var;
        insn = bb_insn->insn;
        uVar9 = *(uint *)&insn->field_0x1c;
        do {
          if (uVar9 <= nop) {
LAB_001718c4:
            free_dead_var(gen_ctx,pdVar19);
            goto LAB_001718d6;
          }
LAB_00171830:
          gen_ctx_00 = (gen_ctx_t)gen_ctx->ctx;
          MIR_insn_op_mode((MIR_context_t)gen_ctx_00,insn,nop,&local_4c);
          if ((local_4c != 0) && (insn->ops[nop].field_0x8 != '\v')) goto LAB_001718a0;
          if (1 < uVar21) {
LAB_0017189d:
            uVar21 = 0;
LAB_001718a0:
            nop = nop + 1;
            if (nop == uVar9) goto LAB_001718c4;
            goto LAB_00171830;
          }
          cVar2 = insn->ops[nop].field_0x8;
          if (cVar2 == '\v') {
            do {
              MVar13 = *(MIR_reg_t *)((long)&insn->ops[nop].u + (ulong)(uVar21 != 0) * 4 + 0x10);
              if (MVar13 != 0xffffffff) {
                uVar21 = uVar21 + 1;
                goto LAB_001718ad;
              }
              bVar22 = uVar21 == 0;
              uVar21 = 1;
            } while (bVar22);
            goto LAB_0017189d;
          }
          if (uVar21 == 1) goto LAB_0017189d;
          uVar21 = 0;
          if (cVar2 != '\x02') goto LAB_001718a0;
          MVar13 = insn->ops[nop].u.reg;
          uVar21 = 1;
LAB_001718ad:
        } while (MVar13 != MVar3);
        pdVar5 = (bb_insn->insn_dead_vars).tail;
        if (pdVar5 == (dead_var_t_conflict)0x0) {
          pDVar15 = local_48;
          if (local_48->head != (dead_var_t_conflict)0x0) {
            combine_delete_insn_cold_5();
            iVar11 = (int)ppdVar20;
            if ((gen_ctx *)gen_ctx_00->ctx != (gen_ctx *)0x0) {
              pMVar16 = (MIR_context_t)((ulong)ppdVar20 & 0xffffffff);
              uVar9 = 0;
              if ((pMVar16 < ((gen_ctx *)gen_ctx_00->ctx)->ctx) &&
                 (*(VARR_size_t **)(&gen_ctx_00->debug_file->_flags + (long)pMVar16 * 2) ==
                  *(VARR_size_t **)&gen_ctx_00->debug_level)) {
                uVar9 = (uint)(extraout_RDX <
                              (&gen_ctx_00->curr_func_item->module)[(long)pMVar16 * 4]);
              }
              return uVar9;
            }
            obsolete_var_p_cold_1();
            pvVar12 = gen_ctx_00->combine_ctx->var_refs_addr;
            if (pvVar12[iVar11].def_p != '\0') {
              pvVar12 = pvVar12 + iVar11;
              if (pvVar12->del_p != '\0') {
                __assert_fail("!gen_ctx->combine_ctx->var_refs_addr[var].del_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x2231,"MIR_insn_t get_uptodate_def_insn(gen_ctx_t, int)");
              }
              pMVar18 = pvVar12->insn;
              if ((*(ulong *)&pMVar18->field_0x18 >> 0x21 == 0) ||
                 ((iVar10 = obsolete_op_p(gen_ctx_00,*(MIR_op_t *)(pMVar18 + 1),pvVar12->insn_num),
                  iVar10 == 0 &&
                  ((*(uint *)&pMVar18->field_0x1c < 3 ||
                   (iVar11 = obsolete_op_p(gen_ctx_00,*(MIR_op_t *)&pMVar18[1].ops[0].u,
                                           gen_ctx_00->combine_ctx->var_refs_addr[iVar11].insn_num),
                   iVar11 == 0)))))) goto LAB_00171a6c;
            }
            pMVar18 = (MIR_insn_t)0x0;
LAB_00171a6c:
            return (int)pMVar18;
          }
        }
        else {
          if ((pdVar5->dead_var_link).next != (dead_var_t)0x0) goto LAB_001719a4;
          pDVar15 = (DLIST_dead_var_t *)&(pdVar5->dead_var_link).next;
        }
        pDVar15->head = pdVar19;
        (pdVar19->dead_var_link).next = (dead_var_t)0x0;
        (pdVar19->dead_var_link).prev = pdVar5;
        (bb_insn->insn_dead_vars).tail = pdVar19;
LAB_001718d6:
        pdVar19 = *ppdVar20;
      } while (pdVar19 != (dead_var_t)0x0);
    }
    gen_delete_insn(gen_ctx,def_insn);
    (&gen_ctx->combine_ctx->var_refs_addr->del_p)[local_40] = '\x01';
    iVar11 = 1;
  }
  return iVar11;
LAB_001719a4:
  combine_delete_insn_cold_4();
LAB_001719a9:
  __assert_fail("var != (4294967295U)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x222,"void remove_bb_insn_dead_var(gen_ctx_t, bb_insn_t, MIR_reg_t)");
}

Assistant:

static int combine_delete_insn (gen_ctx_t gen_ctx, MIR_insn_t def_insn, bb_insn_t bb_insn) {
  MIR_reg_t var;

  gen_assert (def_insn->ops[0].mode == MIR_OP_VAR);
  var = def_insn->ops[0].u.var;
  if (var_ref_ages_addr[var] != curr_bb_var_ref_age || var_refs_addr[var].del_p) return FALSE;
  DEBUG (2, {
    fprintf (debug_file, "      deleting now dead insn ");
    print_bb_insn (gen_ctx, def_insn->data, TRUE);
  });
  remove_bb_insn_dead_var (gen_ctx, bb_insn, var);
  move_bb_insn_dead_vars (gen_ctx, bb_insn, def_insn->data, hard_reg_used_in_bb_insn_p);
  /* We should delete the def insn here because of possible substitution of the def
     insn 'r0 = ... r0 ...'.  We still need valid entry for def here to find obsolete
     definiton, e.g. "r1 = r0; r0 = ...; r0 = ... (deleted); ...= ...r1..." */
  gen_delete_insn (gen_ctx, def_insn);
  var_refs_addr[var].del_p = TRUE; /* to exclude repetitive deletion */
  return TRUE;
}